

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O0

uint8_t * cfd::core::AbstractTransaction::CopyVariableInt(uint64_t v,uint8_t *bytes_out)

{
  unsigned_short uVar1;
  uint uVar2;
  uint64_t v64;
  uint32_t v32;
  uint16_t v16;
  uint8_t v8;
  uint8_t *bytes_out_local;
  uint64_t v_local;
  
  if (v < 0xfd) {
    *bytes_out = (uint8_t)v;
    _v32 = bytes_out + 1;
  }
  else {
    uVar1 = ::std::numeric_limits<unsigned_short>::max();
    if (uVar1 < v) {
      uVar2 = ::std::numeric_limits<unsigned_int>::max();
      if (uVar2 < v) {
        *bytes_out = 0xff;
        *(uint64_t *)(bytes_out + 1) = v;
        _v32 = bytes_out + 9;
      }
      else {
        *bytes_out = 0xfe;
        *(int *)(bytes_out + 1) = (int)v;
        _v32 = bytes_out + 5;
      }
    }
    else {
      *bytes_out = 0xfd;
      *(short *)(bytes_out + 1) = (short)v;
      _v32 = bytes_out + 3;
    }
  }
  return _v32;
}

Assistant:

uint8_t *AbstractTransaction::CopyVariableInt(uint64_t v, uint8_t *bytes_out) {
  if (v <= kViMax8) {
    uint8_t v8 = static_cast<uint8_t>(v);
    memcpy(bytes_out, &v8, sizeof(v8));
    bytes_out += sizeof(v8);
  } else if (v <= std::numeric_limits<uint16_t>::max()) {
    *bytes_out = kViTag16;
    ++bytes_out;
    uint16_t v16 = static_cast<uint16_t>(v);
    memcpy(bytes_out, &v16, sizeof(v16));
    bytes_out += sizeof(v16);
  } else if (v <= std::numeric_limits<uint32_t>::max()) {
    *bytes_out = kViTag32;
    ++bytes_out;
    uint32_t v32 = static_cast<uint32_t>(v);
    memcpy(bytes_out, &v32, sizeof(v32));
    bytes_out += sizeof(v32);
  } else {
    *bytes_out = kViTag64;
    ++bytes_out;
    uint64_t v64 = v;
    memcpy(bytes_out, &v64, sizeof(v64));
    bytes_out += sizeof(v64);
  }

  return bytes_out;
}